

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

interval_t __thiscall duckdb::MakeIntervalNice(duckdb *this,interval_t interval)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  interval_t iVar4;
  
  lVar1 = interval._0_8_;
  if ((int)this < 6) {
    uVar3 = (ulong)this >> 0x20;
    iVar2 = (int)((ulong)this >> 0x20);
    if (iVar2 < 5 && (int)this < 1) {
      if (lVar1 < 21600000000 && iVar2 < 1) {
        if (lVar1 < 3600000000) {
          if (lVar1 < 600000000) {
            if (lVar1 < 60000000) {
              if (9999999 < lVar1) {
                lVar1 = ((lVar1 + 500000U) / 1000000) * 1000000;
              }
            }
            else {
              lVar1 = ((ulong)(
                              "_ZN6duckdb26BitpackingCompressionStateIhLb1EaE16BitpackingWriter13WriteConstantEhmPvb"
                              + lVar1 + 0x2d) / 15000000) * 15000000;
            }
          }
          else {
            lVar1 = ((lVar1 + 30000000U) / 60000000) * 60000000;
          }
        }
        else {
          lVar1 = ((lVar1 + 450000000U) / 900000000) * 900000000;
        }
      }
      else {
        lVar1 = SUB168(SEXT816(lVar1 + 1800000000) * SEXT816(-0x674a40d3fc1ad63b),8) + lVar1 +
                1800000000;
        lVar1 = ((lVar1 >> 0x1f) - (lVar1 >> 0x3f)) * 3600000000;
      }
      goto LAB_01bb744f;
    }
  }
  else {
    uVar3 = 0;
  }
  lVar1 = 0;
LAB_01bb744f:
  iVar4._0_8_ = (ulong)this & 0xffffffff | uVar3 << 0x20;
  iVar4.micros = lVar1;
  return iVar4;
}

Assistant:

interval_t MakeIntervalNice(interval_t interval) {
	if (interval.months >= 6) {
		// if we have more than 6 months, we don't care about days
		interval.days = 0;
		interval.micros = 0;
	} else if (interval.months > 0 || interval.days >= 5) {
		// if we have any months or more than 5 days, we don't care about micros
		interval.micros = 0;
	} else if (interval.days > 0 || interval.micros >= 6 * Interval::MICROS_PER_HOUR) {
		// if we any days or more than 6 hours, we want micros to be roundable by hours at least
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_HOUR);
	} else if (interval.micros >= Interval::MICROS_PER_HOUR) {
		// if we have more than an hour, we want micros to be divisible by quarter hours
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE * 15);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE * 10) {
		// if we have more than 10 minutes, we want micros to be divisible by minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE) {
		// if we have more than a minute, we want micros to be divisible by quarter minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC * 15);
	} else if (interval.micros >= Interval::MICROS_PER_SEC * 10) {
		// if we have more than 10 seconds, we want micros to be divisible by seconds
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC);
	}
	return interval;
}